

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Descriptor.hpp
# Opt level: O2

void __thiscall
ArrayDescriptor::ArrayDescriptor
          (ArrayDescriptor *this,vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *array)

{
  allocator<char> local_59;
  string local_58;
  _Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_59);
  std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::vector
            ((vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)&local_38,array);
  TypeDescriptor::TypeDescriptor
            (&this->super_TypeDescriptor,ARRAY,0.0,&local_58,0.0,
             (vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)&local_38);
  std::_Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::~_Vector_base(&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  (this->super_TypeDescriptor)._vptr_TypeDescriptor = (_func_int **)&PTR__ArrayDescriptor_00117d88;
  std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::vector(&this->_array,array);
  return;
}

Assistant:

explicit ArrayDescriptor(std::vector<TypeDescriptor*>array):  TypeDescriptor(ARRAY, 0, "",false, array), _array{array} {}